

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetJoinerUdpPort
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint16_t aUdpPort)

{
  uint16_t aUdpPort_local;
  JoinerType aType_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetJoinerUdpPort(JoinerType aType, uint16_t aUdpPort)
{
    UNUSED(aType);
    UNUSED(aUdpPort);
    return Error{};
}